

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O3

void slang::ast::SpecparamSymbol::fromSyntax
               (Scope *scope,SpecparamDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *results)

{
  undefined1 *puVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  Compilation *this;
  ExpressionSyntax *pEVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  SpecparamSymbol *pSVar5;
  SourceLocation SVar6;
  ulong uVar7;
  long lVar8;
  SpecparamSymbol *param;
  SourceLocation loc;
  string_view local_60;
  Scope *local_50;
  SpecparamDeclarationSyntax *local_48;
  SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *local_40;
  SourceLocation local_38;
  
  uVar7 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    local_50 = scope;
    local_48 = syntax;
    local_40 = results;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->declarators).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      pSVar2 = *ppSVar4;
      local_38 = parsing::Token::location((Token *)(pSVar2 + 1));
      this = local_50->compilation;
      local_60 = parsing::Token::valueText((Token *)(pSVar2 + 1));
      pSVar5 = BumpAllocator::
               emplace<slang::ast::SpecparamSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
                         (&this->super_BumpAllocator,&local_60,&local_38);
      local_60._M_len = (size_t)pSVar5;
      (pSVar5->super_ValueSymbol).super_Symbol.originatingSyntax = pSVar2;
      (pSVar5->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
      puVar1 = &(pSVar5->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      pEVar3 = *(ExpressionSyntax **)(pSVar2 + 3);
      SVar6 = parsing::Token::location((Token *)&pSVar2[1].previewNode);
      (pSVar5->super_ValueSymbol).declaredType.initializerSyntax = pEVar3;
      (pSVar5->super_ValueSymbol).declaredType.initializerLocation = SVar6;
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_60._M_len,local_50,syntax_00);
      SmallVectorBase<slang::ast::SpecparamSymbol_const*>::
      emplace_back<slang::ast::SpecparamSymbol_const*const&>
                ((SmallVectorBase<slang::ast::SpecparamSymbol_const*> *)local_40,
                 (SpecparamSymbol **)&local_60);
      if (*(long *)(pSVar2 + 4) != 0) {
        *(undefined1 *)(local_60._M_len + 0x150) = 1;
      }
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void SpecparamSymbol::fromSyntax(const Scope& scope, const SpecparamDeclarationSyntax& syntax,
                                 SmallVectorBase<const SpecparamSymbol*>& results) {
    for (auto decl : syntax.declarators) {
        auto loc = decl->name.location();
        auto param = scope.getCompilation().emplace<SpecparamSymbol>(decl->name.valueText(), loc);
        param->setSyntax(*decl);
        param->setDeclaredType(*syntax.type);
        param->setInitializerSyntax(*decl->value1, decl->equals.location());
        param->setAttributes(scope, syntax.attributes);
        results.push_back(param);

        if (decl->value2)
            param->isPathPulse = true;
    }
}